

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall
QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate(QMetaMethodBuilderPrivate *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->tag).d);
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&(this->parameterNames).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->returnType).d);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)this);
  return;
}

Assistant:

QMetaMethodBuilderPrivate
            (QMetaMethod::MethodType _methodType,
             const QByteArray& _signature,
             const QByteArray& _returnType = QByteArray("void"),
             QMetaMethod::Access _access = QMetaMethod::Public,
             int _revision = 0)
        : signature(QMetaObject::normalizedSignature(_signature.constData())),
          returnType(QMetaObject::normalizedType(_returnType)),
          attributes(((int)_access) | (((int)_methodType) << 2)),
          revision(_revision)
    {
        Q_ASSERT((_methodType == QMetaMethod::Constructor) == returnType.isNull());
    }